

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::BaseAssembler::embed(BaseAssembler *this,void *data,size_t dataSize)

{
  Logger *pLVar1;
  Error EVar2;
  ulong uVar3;
  undefined1 *puVar4;
  CodeWriter writer;
  undefined8 local_258;
  ulong uStack_250;
  undefined8 local_248;
  undefined1 *local_240;
  undefined1 local_238 [528];
  
  if ((this->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    EVar2 = BaseEmitter::reportError(&this->super_BaseEmitter,5,(char *)0x0);
    return EVar2;
  }
  if (dataSize == 0) {
    EVar2 = 0;
  }
  else {
    writer._cursor = this->_bufferPtr;
    EVar2 = CodeWriter::ensureSpace(&writer,this,dataSize);
    if (EVar2 == 0) {
      CodeWriter::emitData(&writer,data,dataSize);
      CodeWriter::done(&writer,this);
      pLVar1 = (this->super_BaseEmitter)._logger;
      if (pLVar1 != (Logger *)0x0) {
        local_240 = local_238;
        uStack_250 = 0;
        local_258 = 0x20;
        local_248 = 0x207;
        local_238[0] = 0;
        Formatter::formatData
                  ((String *)&local_258,(pLVar1->_options)._flags,
                   (this->super_BaseEmitter)._environment._arch,kUInt8,data,dataSize,1);
        String::_opChar((String *)&local_258,kAppend,'\n');
        pLVar1 = (this->super_BaseEmitter)._logger;
        uVar3 = uStack_250;
        puVar4 = local_240;
        if ((local_258 & 0xff) < 0x1f) {
          uVar3 = local_258 & 0xff;
          puVar4 = (undefined1 *)((long)&local_258 + 1);
        }
        (*pLVar1->_vptr_Logger[2])(pLVar1,puVar4,uVar3);
        String::reset((String *)&local_258);
      }
    }
  }
  return EVar2;
}

Assistant:

Error BaseAssembler::embed(const void* data, size_t dataSize) {
  if (ASMJIT_UNLIKELY(!_code))
    return reportError(DebugUtils::errored(kErrorNotInitialized));

  if (dataSize == 0)
    return kErrorOk;

  CodeWriter writer(this);
  ASMJIT_PROPAGATE(writer.ensureSpace(this, dataSize));

  writer.emitData(data, dataSize);
  writer.done(this);

#ifndef ASMJIT_NO_LOGGING
  if (_logger) {
    StringTmp<512> sb;
    Formatter::formatData(sb, _logger->flags(), arch(), TypeId::kUInt8, data, dataSize, 1);
    sb.append('\n');
    _logger->log(sb);
  }
#endif

  return kErrorOk;
}